

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool saveCameraCalibration(string *name,Mat *cameraMatrix,Mat *distortionCoefficients)

{
  double dVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  ostream *poVar5;
  ulong uVar6;
  ulong uVar7;
  ofstream outStream;
  long local_230;
  filebuf local_228 [24];
  uint auStack_210 [54];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230,(string *)name,_S_out);
  uVar4 = *(uint *)((long)auStack_210 + *(long *)(local_230 + -0x18));
  if ((uVar4 & 5) == 0) {
    uVar2 = *(ushort *)(cameraMatrix + 8);
    uVar3 = *(ushort *)(cameraMatrix + 0xc);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Camera matrix rows: ",0x14);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Camera matrix rows: ",0x14);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if (uVar2 != 0) {
      uVar6 = 0;
      do {
        if (uVar3 != 0) {
          uVar7 = 0;
          do {
            dVar1 = *(double *)
                     (**(long **)(cameraMatrix + 0x48) * uVar6 + *(long *)(cameraMatrix + 0x10) +
                     uVar7 * 8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"..",2);
            poVar5 = std::ostream::_M_insert<double>(dVar1);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
            uVar7 = uVar7 + 1;
          } while (uVar3 != uVar7);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    uVar2 = *(ushort *)(distortionCoefficients + 8);
    uVar3 = *(ushort *)(distortionCoefficients + 0xc);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Distortion coefficient rows: ",0x1d);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Distortion coefficient columns: ",0x20);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if (uVar2 != 0) {
      uVar6 = 0;
      do {
        if (uVar3 != 0) {
          uVar7 = 0;
          do {
            dVar1 = *(double *)
                     (**(long **)(distortionCoefficients + 0x48) * uVar6 +
                      *(long *)(distortionCoefficients + 0x10) + uVar7 * 8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"..",2);
            poVar5 = std::ostream::_M_insert<double>(dVar1);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
            uVar7 = uVar7 + 1;
          } while (uVar3 != uVar7);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    std::ofstream::close();
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _flush;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return (uVar4 & 5) == 0;
}

Assistant:

bool saveCameraCalibration(std::string name, cv::Mat cameraMatrix, cv::Mat distortionCoefficients) {
    std::ofstream outStream(name);
    if (outStream)
    {
        uint16_t rows = cameraMatrix.rows;
        uint16_t columns = cameraMatrix.cols;


        outStream << rows << std::endl;
        outStream << columns << std::endl;

        std::cout << "Camera matrix rows: " << rows << std::endl;
        std::cout << "Camera matrix rows: " << columns << std::endl;

        for (int r = 0; r < rows; r++) {
            for (int c = 0; c < columns; c++) {
                double value = cameraMatrix.at<double>(r, c);
                std::cout << "..";
                outStream << value << std::endl;
            }
        }
        std::cout << "\n";

        rows = distortionCoefficients.rows;
        columns = distortionCoefficients.cols;

        outStream << rows << std::endl;
        outStream << columns << std::endl;

        std::cout << "Distortion coefficient rows: " << rows << std::endl;
        std::cout << "Distortion coefficient columns: " << columns << std::endl;

        for (int r = 0; r < rows; r++) {
            for (int c = 0; c < columns; c++) {
                double value = distortionCoefficients.at<double>(r, c);
                std::cout << "..";
                outStream << value << std::endl;
            }
        }
        std::cout << "\n";

        outStream.close();
        return true;
    }
    return false;
}